

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O3

void google::protobuf::json_internal::ParseProto3Type::SetDouble(Field f,Msg *msg,double x)

{
  int iVar1;
  double *ptr;
  byte *ptr_00;
  ulong uVar2;
  uint uVar3;
  
  RecordAsSeen(f,msg);
  iVar1 = (f->raw_->field_0)._impl_.number_;
  ptr_00 = (msg->stream_).cur_;
  if ((msg->stream_).impl_.end_ <= ptr_00) {
    ptr_00 = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,ptr_00);
  }
  uVar2 = (ulong)(iVar1 * 8 + 1);
  if (0x7f < (uint)(iVar1 << 3)) {
    do {
      uVar3 = (uint)uVar2;
      *ptr_00 = (byte)uVar2 | 0x80;
      uVar2 = uVar2 >> 7;
      ptr_00 = ptr_00 + 1;
    } while (0x3fff < uVar3);
  }
  *ptr_00 = (byte)uVar2;
  ptr = (double *)(ptr_00 + 1);
  (msg->stream_).cur_ = (uint8_t *)ptr;
  if ((msg->stream_).impl_.end_ <= ptr) {
    ptr = (double *)
          io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,(uint8_t *)ptr);
  }
  *ptr = x;
  (msg->stream_).cur_ = (uint8_t *)(ptr + 1);
  return;
}

Assistant:

static void SetDouble(Field f, Msg& msg, double x) {
    RecordAsSeen(f, msg);
    msg.stream_.WriteTag(f->proto().number() << 3 |
                         WireFormatLite::WIRETYPE_FIXED64);
    msg.stream_.WriteLittleEndian64(absl::bit_cast<uint64_t>(x));
  }